

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

uint32 ParticleColor(int rgb)

{
  byte bVar1;
  uint32 *puVar2;
  Node *pNVar3;
  uint32 uVar4;
  
  puVar2 = (uint32 *)TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::CheckKey(&ColorSaver,rgb)
  ;
  if (puVar2 == (uint32 *)0x0) {
    bVar1 = FColorMatcher::Pick(&ColorMatcher,(uint)rgb >> 0x10 & 0xff,(uint)rgb >> 8 & 0xff,
                                rgb & 0xff);
    uVar4 = (uint)bVar1 << 0x18 | rgb;
    pNVar3 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode(&ColorSaver,rgb);
    (pNVar3->Pair).Value = uVar4;
  }
  else {
    uVar4 = *puVar2;
  }
  return uVar4;
}

Assistant:

static uint32 ParticleColor(int rgb)
{
	int *val;
	int stuff;

	val = ColorSaver.CheckKey(rgb);
	if (val != NULL)
	{
		return *val;
	}
	stuff = rgb | (ColorMatcher.Pick(RPART(rgb), GPART(rgb), BPART(rgb)) << 24);
	ColorSaver[rgb] = stuff;
	return stuff;
}